

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_JSONStringify(JSContext *ctx,JSValue obj,JSValue replacer,JSValue space0)

{
  ushort uVar1;
  int iVar2;
  JSValueUnion JVar3;
  JSShape *pJVar4;
  JSValue key;
  JSValue indent;
  JSValue val;
  JSValue JVar5;
  StringBuffer *pSVar6;
  JSValueUnion JVar7;
  JSValueUnion JVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint end;
  JSValueUnion JVar13;
  JSRefCountHeader *p_6;
  JSRuntime *pJVar14;
  JSValueUnion JVar15;
  JSValue *argv;
  JSRefCountHeader *p_3;
  ulong uVar16;
  JSRefCountHeader *p;
  ulong uVar17;
  int64_t iVar18;
  ulong uVar19;
  JSValue this_obj;
  JSValue v;
  JSValue JVar20;
  JSValue JVar21;
  JSValue JVar22;
  JSValue JVar23;
  JSValue JVar24;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  int n_1;
  JSONStringifyContext jsc_s;
  int64_t n;
  StringBuffer b_s;
  int32_t iVar25;
  undefined4 uVar26;
  JSValueUnion local_110;
  ulong local_108;
  int local_fc;
  JSValue local_f8;
  long local_e8;
  int64_t local_e0;
  JSValueUnion local_d8;
  JSValueUnion local_d0;
  int64_t local_c8;
  JSValueUnion local_c0;
  JSValueUnion local_b8;
  JSValueUnion local_b0;
  JSValueUnion local_a0;
  int64_t local_98;
  JSValueUnion local_90;
  int64_t local_88;
  JSValueUnion local_80;
  int64_t iStack_78;
  StringBuffer *local_70;
  long local_68;
  void *local_60;
  void *local_58;
  StringBuffer local_50;
  JSValueUnion JVar12;
  
  JVar15 = (JSValueUnion)replacer.tag;
  JVar12 = replacer.u;
  local_c8 = obj.tag;
  local_d0 = obj.u;
  local_c0.float64 = local_c0.float64 & 0xffffffff00000000;
  local_b8.float64 = 1.48219693752374e-323;
  local_a0.ptr = (void *)(local_a0 << 0x20);
  local_98 = 3;
  local_90.ptr = (void *)(local_90 << 0x20);
  local_88 = 3;
  local_70 = &local_50;
  JVar3 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + 0x2f))->ptr;
  *(int *)JVar3.ptr = *JVar3.ptr + 1;
  iStack_78 = -7;
  local_50.len = 0;
  local_50.size = 0;
  local_50.is_wide_char = 0;
  local_50.error_status = 0;
  JVar13 = JVar12;
  local_80 = JVar3;
  local_50.ctx = ctx;
  local_50.str = js_alloc_string(ctx,0,0);
  if (local_50.str == (JSString *)0x0) {
    local_50._16_8_ = local_50._16_8_ & 0xffffffff;
    local_50.error_status = -1;
  }
  pJVar4 = ctx->array_shape;
  (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
  _local_b0 = JS_NewObjectFromShape(ctx,pJVar4,2);
  JVar24.tag = local_e0;
  JVar24.u.ptr = local_d8.ptr;
  if (local_b0._8_4_ == 6) goto LAB_0012c239;
  JVar7 = local_c0;
  JVar8 = local_b8;
  if ((int)replacer.tag == -1) {
    uVar1 = *(ushort *)((long)JVar12.ptr + 6);
    JVar13._2_6_ = 0;
    JVar13.int32._0_2_ = uVar1;
    JVar7 = JVar12;
    JVar8 = JVar15;
    if (uVar1 == 0xd) goto LAB_0012c1a4;
    if (uVar1 != 0x29) {
      if (ctx->rt->class_array[(long)JVar13].call == (JSClassCall *)0x0) {
        if (uVar1 == 0x29) goto LAB_0012c167;
        uVar9 = (uint)(uVar1 == 2);
        goto LAB_0012c485;
      }
      goto LAB_0012c1a4;
    }
    if (*(char *)(*(long *)((long)JVar12.ptr + 0x30) + 0x20) != '\0') goto LAB_0012c1a4;
LAB_0012c167:
    uVar9 = js_proxy_isArray(ctx,replacer);
    JVar24.tag = local_e0;
    JVar24.u.ptr = local_d8.ptr;
    if ((int)uVar9 < 0) goto LAB_0012c239;
LAB_0012c485:
    JVar7 = local_c0;
    JVar8 = local_b8;
    if (uVar9 == 0) goto LAB_0012c1a4;
    pJVar4 = ctx->array_shape;
    (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
    _local_a0 = JS_NewObjectFromShape(ctx,pJVar4,2);
    local_e0 = local_a0;
    local_d8 = local_a0;
    JVar24 = _local_a0;
    if (local_a0._8_4_ != 6) {
      iVar11 = js_get_length64(ctx,(int64_t *)&local_58,replacer);
      JVar24.tag = local_e0;
      JVar24.u.ptr = local_d8.ptr;
      if (iVar11 == 0) {
        local_60 = local_58;
        JVar13 = JVar15;
        JVar7 = local_c0;
        JVar8 = local_b8;
        if (0 < (long)local_58) {
          JVar21 = (JSValue)(ZEXT816(3) << 0x40);
          JVar13.float64 = 0.0;
          local_e8 = 0;
          do {
            JVar22 = JS_GetPropertyInt64(ctx,replacer,(int64_t)JVar13);
            JVar24.tag = local_e0;
            JVar24.u.ptr = local_d8.ptr;
            local_108 = JVar22.tag;
            JVar12 = JVar22.u;
            uVar9 = (uint)JVar22.tag;
            uVar17 = local_108 & 0xffffffff;
            local_f8 = JVar22;
            switch(uVar9) {
            case 0:
            case 7:
switchD_0012c549_caseD_0:
              local_f8 = JS_ToStringFree(ctx,JVar22);
              JVar24.tag = local_e0;
              JVar24.u.ptr = local_d8.ptr;
              if ((int)local_f8.tag == 6) goto LAB_0012c239;
LAB_0012c573:
              JVar22 = local_f8;
              argv = &local_f8;
              JVar23.tag = local_e0;
              JVar23.u.ptr = local_d8.ptr;
              JVar23 = js_array_includes(ctx,JVar23,1,argv);
              JVar24.tag = local_e0;
              JVar24.u.ptr = local_d8.ptr;
              local_110 = JVar22.u;
              local_108 = JVar22.tag;
              if ((int)JVar23.tag == 6) {
                if ((uint)JVar22.tag < 0xfffffff5) goto LAB_0012c239;
                iVar11 = *local_110.ptr;
                *(int *)local_110.ptr = iVar11 + -1;
                if (iVar11 < 2) {
                  __JS_FreeValueRT(ctx->rt,JVar22);
                }
                goto LAB_0012c3f6;
              }
              iVar11 = JS_ToBoolFree(ctx,JVar23);
              if (iVar11 == 0) {
                local_68 = local_e8 + 1;
                this_obj.tag = local_e0;
                this_obj.u.ptr = local_d8.ptr;
                JS_SetPropertyInt64(ctx,this_obj,local_e8,JVar22);
                local_e8 = local_68;
              }
              else if (0xfffffff4 < (uint)JVar22.tag) {
                JVar22.tag = (int64_t)argv;
                JVar22.u.ptr = local_110.ptr;
                iVar11 = *local_110.ptr;
                *(int *)local_110.ptr = iVar11 + -1;
                if (iVar11 < 2) {
                  pJVar14 = ctx->rt;
                  goto LAB_0012c653;
                }
              }
              break;
            default:
              if (uVar9 == 0xfffffff9) goto LAB_0012c573;
              if (0xfffffff4 < uVar9) goto LAB_0012c640;
              break;
            case 6:
              goto LAB_0012c23f;
            case 0xffffffff:
              if ((*(ushort *)((long)JVar12.ptr + 6) & 0xfffe) == 4) goto switchD_0012c549_caseD_0;
LAB_0012c640:
              iVar11 = *JVar12.ptr;
              *(int *)JVar12.ptr = iVar11 + -1;
              if (1 < iVar11) break;
              pJVar14 = ctx->rt;
LAB_0012c653:
              v.u = JVar22.u;
              v.tag = local_108;
              __JS_FreeValueRT(pJVar14,v);
            }
            JVar13.float64 = JVar13.float64 + 1;
            JVar7 = local_c0;
            JVar8 = local_b8;
          } while (local_60 != JVar13.ptr);
        }
        goto LAB_0012c1a4;
      }
    }
LAB_0012c239:
    JVar21 = (JSValue)(ZEXT816(3) << 0x40);
    uVar17 = 6;
  }
  else {
LAB_0012c1a4:
    local_b8 = JVar8;
    local_c0 = JVar7;
    if (0xfffffff4 < (uint)space0.tag) {
      *(int *)space0.u.ptr = *space0.u.ptr + 1;
    }
    if ((uint)space0.tag == 0xffffffff) {
      if (*(short *)((long)space0.u.ptr + 6) == 5) {
        space0 = JS_ToStringFree(ctx,space0);
      }
      else if (*(short *)((long)space0.u.ptr + 6) == 4) {
        space0 = JS_ToNumberHintFree(ctx,space0,JVar13.int32);
      }
      JVar24.tag = local_e0;
      JVar24.u.ptr = local_d8.ptr;
      if ((int)space0.tag == 6) goto LAB_0012c239;
    }
    JVar13 = space0.u;
    uVar9 = (uint)space0.tag;
    if ((uVar9 == 7) || (uVar9 == 0)) {
      iVar11 = JS_ToInt32Clamp(ctx,&local_fc,space0,0,10,0);
      JVar24.tag = local_e0;
      JVar24.u.ptr = local_d8.ptr;
      if (iVar11 != 0) goto LAB_0012c239;
      _local_90 = JS_NewStringLen(ctx,"          ",(long)local_fc);
      iVar11 = local_90._8_4_;
    }
    else {
      if (uVar9 == 0xfffffff9) {
        uVar10 = *(uint *)((long)JVar13.ptr + 4) & 0x7fffffff;
        end = 10;
        if (uVar10 < 10) {
          end = uVar10;
        }
        _local_90 = js_sub_string(ctx,(JSString *)JVar13.ptr,0,end);
      }
      else {
        *(int *)JVar3.ptr = *JVar3.ptr + 1;
        local_88 = -7;
        local_90.ptr = JVar3.ptr;
      }
      iVar11 = local_90._8_4_;
      if ((0xfffffff4 < uVar9) && (iVar2 = *JVar13.ptr, *(int *)JVar13.ptr = iVar2 + -1, iVar2 < 2))
      {
        __JS_FreeValueRT(ctx->rt,space0);
      }
    }
    uVar17 = 6;
    if (iVar11 == 6) {
LAB_0012c3f6:
      JVar24.tag = local_e0;
      JVar24.u.ptr = local_d8.ptr;
      uVar17 = 6;
      JVar21 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      JVar21 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
      iVar18 = local_c8;
      JVar3 = local_d0;
      JVar24.tag = local_e0;
      JVar24.u.ptr = local_d8.ptr;
      if ((int)JVar21.tag != 6) {
        if ((uint)local_c8 < 0xfffffff5) {
          val_01.tag = local_c8;
          val_01.u.ptr = local_d0.ptr;
          iVar11 = JS_DefinePropertyValue(ctx,JVar21,0x2f,val_01,7);
          JVar24.tag = local_e0;
          JVar24.u.ptr = local_d8.ptr;
          if (-1 < iVar11) goto LAB_0012c6a0;
        }
        else {
          *(int *)local_d0.ptr = *local_d0.ptr + 1;
          val_00.tag = local_c8;
          val_00.u.ptr = local_d0.ptr;
          iVar11 = JS_DefinePropertyValue(ctx,JVar21,0x2f,val_00,7);
          JVar24.tag = local_e0;
          JVar24.u.ptr = local_d8.ptr;
          if (-1 < iVar11) {
            *(int *)JVar3.ptr = *JVar3.ptr + 1;
            iVar18 = local_c8;
LAB_0012c6a0:
            iVar25 = local_80.int32;
            uVar26 = local_80._4_4_;
            key.tag = iStack_78;
            key.u.float64 = local_80.float64;
            val_02.tag = iVar18;
            val_02.u.ptr = JVar3.ptr;
            iVar18 = iStack_78;
            JVar22 = js_json_check(ctx,(JSONStringifyContext *)&local_c0,JVar21,val_02,key);
            JVar24.tag = local_e0;
            JVar24.u.ptr = local_d8.ptr;
            JVar5.tag = local_e0;
            JVar5.u.ptr = local_d8.ptr;
            if ((int)JVar22.tag == 3) {
              uVar17 = 3;
            }
            else if ((int)JVar22.tag == 6) {
              uVar17 = JVar22.tag & 0xffffffff;
              JVar24 = JVar5;
            }
            else {
              val.tag = iStack_78;
              val.u.float64 = local_80.float64;
              indent.u._4_4_ = uVar26;
              indent.u.int32 = iVar25;
              indent.tag = iVar18;
              iVar11 = js_json_to_str(ctx,(JSONStringifyContext *)&local_c0,JVar22,val,indent);
              JVar24.tag = local_e0;
              JVar24.u.ptr = local_d8.ptr;
              if (iVar11 == 0) {
                JVar24 = string_buffer_end(local_70);
                uVar17 = JVar24.tag;
                uVar19 = (ulong)JVar24.u.ptr & 0xffffffff00000000;
                uVar16 = (ulong)JVar24.u._0_4_;
                goto LAB_0012c267;
              }
            }
          }
        }
      }
    }
  }
LAB_0012c23f:
  pSVar6 = local_70;
  local_e0 = JVar24.tag;
  local_d8 = JVar24.u;
  pJVar14 = local_70->ctx->rt;
  (*(pJVar14->mf).js_free)(&pJVar14->malloc_state,local_70->str);
  pSVar6->str = (JSString *)0x0;
  uVar16 = 0;
  uVar19 = 0;
LAB_0012c267:
  if ((0xfffffff4 < (uint)JVar21.tag) &&
     (iVar11 = *JVar21.u.ptr, *(int *)JVar21.u.ptr = iVar11 + -1, iVar11 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar21);
  }
  if ((0xfffffff4 < (uint)iStack_78) &&
     (iVar11 = *local_80.ptr, *(int *)local_80.ptr = iVar11 + -1, iVar11 < 2)) {
    JVar21.tag = iStack_78;
    JVar21.u.ptr = local_80.ptr;
    __JS_FreeValueRT(ctx->rt,JVar21);
  }
  if (0xfffffff4 < local_90._8_4_) {
    iVar11 = *local_90.ptr;
    *(int *)local_90.ptr = iVar11 + -1;
    if (iVar11 < 2) {
      __JS_FreeValueRT(ctx->rt,_local_90);
    }
  }
  if (0xfffffff4 < local_a0._8_4_) {
    iVar11 = *local_a0.ptr;
    *(int *)local_a0.ptr = iVar11 + -1;
    if (iVar11 < 2) {
      __JS_FreeValueRT(ctx->rt,_local_a0);
    }
  }
  if (0xfffffff4 < local_b0._8_4_) {
    iVar11 = *local_b0.ptr;
    *(int *)local_b0.ptr = iVar11 + -1;
    if (iVar11 < 2) {
      __JS_FreeValueRT(ctx->rt,_local_b0);
    }
  }
  JVar20.tag = uVar17;
  JVar20.u.ptr = (void *)(uVar19 | uVar16);
  return JVar20;
}

Assistant:

JSValue JS_JSONStringify(JSContext *ctx, JSValueConst obj,
                         JSValueConst replacer, JSValueConst space0)
{
    StringBuffer b_s;
    JSONStringifyContext jsc_s, *jsc = &jsc_s;
    JSValue val, v, space, ret, wrapper;
    int res;
    int64_t i, j, n;

    jsc->replacer_func = JS_UNDEFINED;
    jsc->stack = JS_UNDEFINED;
    jsc->property_list = JS_UNDEFINED;
    jsc->gap = JS_UNDEFINED;
    jsc->b = &b_s;
    jsc->empty = JS_AtomToString(ctx, JS_ATOM_empty_string);
    ret = JS_UNDEFINED;
    wrapper = JS_UNDEFINED;

    string_buffer_init(ctx, jsc->b, 0);
    jsc->stack = JS_NewArray(ctx);
    if (JS_IsException(jsc->stack))
        goto exception;
    if (JS_IsFunction(ctx, replacer)) {
        jsc->replacer_func = replacer;
    } else {
        res = JS_IsArray(ctx, replacer);
        if (res < 0)
            goto exception;
        if (res) {
            /* XXX: enumeration is not fully correct */
            jsc->property_list = JS_NewArray(ctx);
            if (JS_IsException(jsc->property_list))
                goto exception;
            if (js_get_length64(ctx, &n, replacer))
                goto exception;
            for (i = j = 0; i < n; i++) {
                JSValue present;
                v = JS_GetPropertyInt64(ctx, replacer, i);
                if (JS_IsException(v))
                    goto exception;
                if (JS_IsObject(v)) {
                    JSObject *p = JS_VALUE_GET_OBJ(v);
                    if (p->class_id == JS_CLASS_STRING ||
                        p->class_id == JS_CLASS_NUMBER) {
                        v = JS_ToStringFree(ctx, v);
                        if (JS_IsException(v))
                            goto exception;
                    } else {
                        JS_FreeValue(ctx, v);
                        continue;
                    }
                } else if (JS_IsNumber(v)) {
                    v = JS_ToStringFree(ctx, v);
                    if (JS_IsException(v))
                        goto exception;
                } else if (!JS_IsString(v)) {
                    JS_FreeValue(ctx, v);
                    continue;
                }
                present = js_array_includes(ctx, jsc->property_list,
                                            1, (JSValueConst *)&v);
                if (JS_IsException(present)) {
                    JS_FreeValue(ctx, v);
                    goto exception;
                }
                if (!JS_ToBoolFree(ctx, present)) {
                    JS_SetPropertyInt64(ctx, jsc->property_list, j++, v);
                } else {
                    JS_FreeValue(ctx, v);
                }
            }
        }
    }
    space = JS_DupValue(ctx, space0);
    if (JS_IsObject(space)) {
        JSObject *p = JS_VALUE_GET_OBJ(space);
        if (p->class_id == JS_CLASS_NUMBER) {
            space = JS_ToNumberFree(ctx, space);
        } else if (p->class_id == JS_CLASS_STRING) {
            space = JS_ToStringFree(ctx, space);
        }
        if (JS_IsException(space)) {
            JS_FreeValue(ctx, space);
            goto exception;
        }
    }
    if (JS_IsNumber(space)) {
        int n;
        if (JS_ToInt32Clamp(ctx, &n, space, 0, 10, 0))
            goto exception;
        jsc->gap = JS_NewStringLen(ctx, "          ", n);
    } else if (JS_IsString(space)) {
        JSString *p = JS_VALUE_GET_STRING(space);
        jsc->gap = js_sub_string(ctx, p, 0, min_int(p->len, 10));
    } else {
        jsc->gap = JS_DupValue(ctx, jsc->empty);
    }
    JS_FreeValue(ctx, space);
    if (JS_IsException(jsc->gap))
        goto exception;
    wrapper = JS_NewObject(ctx);
    if (JS_IsException(wrapper))
        goto exception;
    if (JS_DefinePropertyValue(ctx, wrapper, JS_ATOM_empty_string,
                               JS_DupValue(ctx, obj), JS_PROP_C_W_E) < 0)
        goto exception;
    val = JS_DupValue(ctx, obj);
                           
    val = js_json_check(ctx, jsc, wrapper, val, jsc->empty);
    if (JS_IsException(val))
        goto exception;
    if (JS_IsUndefined(val)) {
        ret = JS_UNDEFINED;
        goto done1;
    }
    if (js_json_to_str(ctx, jsc, wrapper, val, jsc->empty))
        goto exception;

    ret = string_buffer_end(jsc->b);
    goto done;

exception:
    ret = JS_EXCEPTION;
done1:
    string_buffer_free(jsc->b);
done:
    JS_FreeValue(ctx, wrapper);
    JS_FreeValue(ctx, jsc->empty);
    JS_FreeValue(ctx, jsc->gap);
    JS_FreeValue(ctx, jsc->property_list);
    JS_FreeValue(ctx, jsc->stack);
    return ret;
}